

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParserValidationErrorTest_Proto2JsonConflictLegacy_Test
::~ParserValidationErrorTest_Proto2JsonConflictLegacy_Test
          (ParserValidationErrorTest_Proto2JsonConflictLegacy_Test *this)

{
  ParserValidationErrorTest_Proto2JsonConflictLegacy_Test *this_local;
  
  ParserTest::~ParserTest(&this->super_ParserValidationErrorTest);
  return;
}

Assistant:

TEST_F(ParserValidationErrorTest, Proto2JsonConflictLegacy) {
  ExpectParsesTo(
      "syntax = 'proto2';\n"
      "message TestMessage {\n"
      "  option deprecated_legacy_json_field_conflicts = true;\n"
      "  optional uint32 fooBar = 1;\n"
      "  optional uint32 foo_bar = 2;\n"
      "}\n",
      "syntax: 'proto2'\n"
      "message_type {\n"
      "  name: 'TestMessage'\n"
      "  field {\n"
      "    label: LABEL_OPTIONAL type: TYPE_UINT32 name: 'fooBar' number: 1\n"
      "  }\n"
      "  field {\n"
      "    label: LABEL_OPTIONAL type: TYPE_UINT32 name: 'foo_bar' number: 2\n"
      "  }\n"
      "  options {\n"
      "    uninterpreted_option {\n"
      "      name {\n"
      "        name_part: 'deprecated_legacy_json_field_conflicts'\n"
      "        is_extension: false\n"
      "      }\n"
      "      identifier_value: 'true'\n"
      "    }\n"
      "  }\n"
      "}\n");
}